

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_int_base.cpp
# Opt level: O0

bool __thiscall sc_dt::sc_int_base::xor_reduce(sc_int_base *this)

{
  sbyte sVar1;
  int n;
  uint_type val;
  uint_type mask;
  sc_int_base *this_local;
  
  mask = 0xffffffffffffffff;
  val = this->m_val & 0xffffffffffffffffU >> ((byte)this->m_ulen & 0x3f);
  n = 0x40;
  do {
    n = n >> 1;
    sVar1 = (sbyte)n;
    mask = mask >> sVar1;
    val = (val & mask << sVar1) >> sVar1 ^ val & mask;
  } while (n != 1);
  return val != 0;
}

Assistant:

bool
sc_int_base::xor_reduce() const
{
    uint_type mask = ~UINT_ZERO;
    uint_type val = m_val & (mask >> m_ulen);
    int n = SC_INTWIDTH;
    do {
	n >>= 1;
	mask >>= n;
	val = ((val & (mask << n)) >> n) ^ (val & mask);
    } while( n != 1 );
    return ( val != uint_type( 0 ) );
}